

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O1

void __thiscall OpenMD::Shake::constraintF(Shake *this)

{
  _List_node_base *p_Var1;
  Molecule *pMVar2;
  _List_node_base *p_Var3;
  pointer ppCVar4;
  ConstraintPair *pCVar5;
  RealType RVar6;
  list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> constraints;
  MoleculeIterator mi;
  _List_node_base local_50;
  long local_40;
  MoleculeIterator local_38;
  
  if (this->doShake_ == true) {
    doConstraint(this,0x180104);
    RVar6 = Snapshot::getTime(this->currentSnapshot_);
    if (this->currConstraintTime_ <= RVar6) {
      local_38._M_node = (_Base_ptr)0x0;
      local_50._M_next = &local_50;
      local_40 = 0;
      local_50._M_prev = local_50._M_next;
      pMVar2 = SimInfo::beginMolecule(this->info_,&local_38);
      while (pMVar2 != (Molecule *)0x0) {
        ppCVar4 = (pMVar2->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppCVar4 ==
            (pMVar2->constraintPairs_).
            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pCVar5 = (ConstraintPair *)0x0;
        }
        else {
          pCVar5 = *ppCVar4;
        }
        while (pCVar5 != (ConstraintPair *)0x0) {
          ppCVar4 = ppCVar4 + 1;
          p_Var3 = (_List_node_base *)operator_new(0x18);
          p_Var3[1]._M_next = (_List_node_base *)pCVar5;
          std::__detail::_List_node_base::_M_hook(p_Var3);
          local_40 = local_40 + 1;
          if (ppCVar4 ==
              (pMVar2->constraintPairs_).
              super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pCVar5 = (ConstraintPair *)0x0;
          }
          else {
            pCVar5 = *ppCVar4;
          }
        }
        pMVar2 = SimInfo::nextMolecule(this->info_,&local_38);
      }
      ConstraintWriter::writeConstraintForces
                (this->constraintWriter_,
                 (list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                 &local_50);
      this->currConstraintTime_ = this->constraintTime_ + this->currConstraintTime_;
      p_Var3 = local_50._M_next;
      while (p_Var3 != &local_50) {
        p_Var1 = (((_List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var1;
      }
    }
  }
  return;
}

Assistant:

void Shake::constraintF() {
    if (!doShake_) return;
    doConstraint(&Shake::constraintPairF);

    if (currentSnapshot_->getTime() >= currConstraintTime_) {
      Molecule* mol;
      SimInfo::MoleculeIterator mi;
      ConstraintPair* consPair;
      Molecule::ConstraintPairIterator cpi;
      std::list<ConstraintPair*> constraints;
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          constraints.push_back(consPair);
        }
      }

      constraintWriter_->writeConstraintForces(constraints);
      currConstraintTime_ += constraintTime_;
    }
  }